

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O2

void __thiscall cmCursesLongMessageForm::UpdateStatusBar(cmCursesLongMessageForm *this)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  size_t i_1;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  size_t i;
  size_t sVar8;
  char fmt_s [3];
  char vertmp [128];
  char version [512];
  char bar [512];
  
  if (_stdscr == 0) {
    uVar4 = 0xffffffff;
    uVar7 = uVar4;
  }
  else {
    uVar4 = (int)*(short *)(_stdscr + 6) + 1;
    uVar7 = (int)*(short *)(_stdscr + 4) + 1;
  }
  uVar6 = (this->Title)._M_string_length;
  sVar8 = 0x1ff;
  if (uVar6 < 0x1ff) {
    sVar8 = uVar6;
  }
  strncpy(bar,(this->Title)._M_dataplus._M_p,sVar8);
  for (; sVar8 != 0x200; sVar8 = sVar8 + 1) {
    bar[sVar8] = ' ';
  }
  uVar1 = 0x1ff;
  if (uVar4 < 0x1ff) {
    uVar1 = uVar4;
  }
  uVar6 = (ulong)uVar1;
  bar[uVar6] = '\0';
  pcVar2 = cmVersion::GetCMakeVersion();
  snprintf(vertmp,0x80,"CMake Version %s",pcVar2);
  sVar8 = strlen(vertmp);
  lVar3 = uVar6 - sVar8;
  for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
    version[lVar5] = ' ';
  }
  snprintf(version + lVar3,0x200 - lVar3,"%s",vertmp);
  version[uVar6] = '\0';
  fmt_s[2] = '\0';
  fmt_s[0] = '%';
  fmt_s[1] = 's';
  move(uVar7 - 4,0);
  wattr_on(_stdscr,0x10000,0);
  printw(fmt_s,bar);
  wattr_off(_stdscr,0x10000,0);
  move(uVar7 - 3,0);
  printw(fmt_s,version);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesLongMessageForm::UpdateStatusBar()
{
  int x;
  int y;
  getmaxyx(stdscr, y, x);

  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t size = this->Title.size();
  if (size >= cmCursesMainForm::MAX_WIDTH) {
    size = cmCursesMainForm::MAX_WIDTH - 1;
  }
  strncpy(bar, this->Title.c_str(), size);
  for (size_t i = size; i < cmCursesMainForm::MAX_WIDTH; i++) {
    bar[i] = ' ';
  }
  int width;
  if (x >= 0 && x < cmCursesMainForm::MAX_WIDTH) {
    width = x;
  } else {
    width = cmCursesMainForm::MAX_WIDTH - 1;
  }

  bar[width] = '\0';

  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  snprintf(vertmp, sizeof(vertmp), "CMake Version %s",
           cmVersion::GetCMakeVersion());
  size_t sideSpace = (width - strlen(vertmp));
  for (size_t i = 0; i < sideSpace; i++) {
    version[i] = ' ';
  }
  snprintf(version + sideSpace, sizeof(version) - sideSpace, "%s", vertmp);
  version[width] = '\0';

  char fmt_s[] = "%s";
  curses_move(y - 4, 0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y - 3, 0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}